

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  char *replace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  string local_138 [8];
  string reg;
  string key;
  undefined1 local_e8 [8];
  RegularExpression regEntry;
  KeyWOW64 param_1_local;
  string *source_local;
  
  regEntry._204_4_ = param_2;
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_e8,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_e8,source);
    if (!bVar1) break;
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&reg.field_2 + 8),(RegularExpression *)local_e8,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_138,"[",&local_139);
    std::allocator<char>::~allocator(&local_139);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&reg.field_2 + 8),"]");
    std::__cxx11::string::operator+=(local_138,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    replace = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::ReplaceString(source,replace,"/registry");
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string((string *)(reg.field_2._M_local_buf + 8));
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_e8);
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = "[";
    reg += key + "]";
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}